

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

_Bool oonf_layer2_net_remove(oonf_layer2_net *l2net,oonf_layer2_origin *origin)

{
  list_entity *plVar1;
  _Bool _Var2;
  _Bool _Var3;
  list_entity *plVar4;
  byte bVar5;
  
  if (((l2net->_node).list.next == (list_entity *)0x0) ||
     ((l2net->_node).list.prev == (list_entity *)0x0)) {
    _Var2 = false;
  }
  else {
    bVar5 = 0;
    plVar4 = (l2net->neighbors).list_head.next;
    while (plVar4->prev != (l2net->neighbors).list_head.prev) {
      plVar1 = plVar4->next;
      _Var2 = oonf_layer2_neigh_remove((oonf_layer2_neigh *)(plVar4 + -0x4c),origin);
      bVar5 = bVar5 | _Var2;
      plVar4 = plVar1;
    }
    _Var2 = false;
    _Var3 = oonf_layer2_net_cleanup(l2net,origin,false);
    if (_Var3 || bVar5 != 0) {
      oonf_layer2_net_commit(l2net);
      _Var2 = true;
    }
  }
  return _Var2;
}

Assistant:

bool
oonf_layer2_net_remove(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin) {
  struct oonf_layer2_neigh *l2neigh, *l2neigh_it;
  bool changed = false;

  if (!avl_is_node_added(&l2net->_node)) {
    return false;
  }

  avl_for_each_element_safe(&l2net->neighbors, l2neigh, _node, l2neigh_it) {
    if (oonf_layer2_neigh_remove(l2neigh, origin)) {
      changed = true;
    }
  }

  if (oonf_layer2_net_cleanup(l2net, origin, false)) {
    changed = true;
  }

  if (changed) {
    oonf_layer2_net_commit(l2net);
  }
  return changed;
}